

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  uint uVar1;
  vfloat<4> vVar2;
  BVH *bvh;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  uint uVar24;
  undefined4 uVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  NodeRef root;
  size_t sVar31;
  size_t sVar32;
  uint uVar33;
  NodeRef *pNVar34;
  ulong uVar35;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar36;
  bool bVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar52;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar47;
  float fVar48;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar76;
  float fVar106;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar77;
  float fVar103;
  undefined1 auVar88 [16];
  float fVar78;
  float fVar104;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar102;
  float fVar105;
  undefined1 auVar101 [64];
  float fVar107;
  float fVar108;
  float fVar124;
  float fVar125;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar126;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar127;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar128;
  float fVar140;
  float fVar141;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar142;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar143;
  float fVar154;
  float fVar155;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar156;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar168;
  float fVar174;
  float fVar175;
  undefined1 auVar169 [16];
  float fVar176;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar177;
  float fVar185;
  float fVar186;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar187;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar188;
  float fVar194;
  float fVar195;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar196;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar212;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar213;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar211;
  float fVar214;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar215;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar216 [16];
  undefined1 auVar220 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar221;
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar224 [64];
  undefined1 auVar228 [64];
  float fVar229;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar230 [16];
  float fVar234;
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar235 [16];
  Precalculations pre;
  undefined1 local_1a98 [16];
  float local_1a88;
  float fStack_1a84;
  float fStack_1a80;
  undefined1 local_1a78 [8];
  float fStack_1a70;
  undefined4 uStack_1a6c;
  float local_1a48;
  float fStack_1a44;
  float fStack_1a40;
  undefined1 local_1a38 [16];
  RayK<4> *local_1a20;
  undefined1 local_1a18 [16];
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  undefined1 local_19c8 [16];
  undefined1 local_19a8 [16];
  undefined1 local_1998 [16];
  undefined1 local_1988 [16];
  undefined1 local_1918 [8];
  float fStack_1910;
  float fStack_190c;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  RTCHitN local_18c8 [16];
  undefined1 local_18b8 [16];
  undefined1 local_18a8 [16];
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  undefined1 local_1878 [16];
  undefined1 local_1868 [16];
  uint local_1858;
  uint uStack_1854;
  uint uStack_1850;
  uint uStack_184c;
  uint uStack_1848;
  uint uStack_1844;
  uint uStack_1840;
  uint uStack_183c;
  TravRayK<4,_true> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar23 = mm_lookupmask_ps._248_8_;
  uVar22 = mm_lookupmask_ps._240_8_;
  uVar21 = mm_lookupmask_ps._8_8_;
  uVar20 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar46 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar73 = vpcmpeqd_avx(auVar46,(undefined1  [16])valid_i->field_0);
    auVar60 = ZEXT816(0) << 0x40;
    auVar9 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar60,5);
    auVar129 = auVar73 & auVar9;
    if ((((auVar129 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar129 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar129 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar129[0xf] < '\0'
       ) {
      auVar9 = vandps_avx(auVar9,auVar73);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar86._8_4_ = 0x7fffffff;
      auVar86._0_8_ = 0x7fffffff7fffffff;
      auVar86._12_4_ = 0x7fffffff;
      auVar73 = vandps_avx(auVar86,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar189._8_4_ = 0x219392ef;
      auVar189._0_8_ = 0x219392ef219392ef;
      auVar189._12_4_ = 0x219392ef;
      auVar129 = vcmpps_avx(auVar73,auVar189,1);
      auVar216._8_4_ = 0x3f800000;
      auVar216._0_8_ = 0x3f8000003f800000;
      auVar216._12_4_ = 0x3f800000;
      auVar157 = vdivps_avx(auVar216,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar73 = vandps_avx(auVar86,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar85 = vcmpps_avx(auVar73,auVar189,1);
      auVar158 = vdivps_avx(auVar216,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar73 = vandps_avx(auVar86,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar73 = vcmpps_avx(auVar73,auVar189,1);
      auVar190._8_4_ = 0x5d5e0b6b;
      auVar190._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar190._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar157,auVar190,auVar129);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar158,auVar190,auVar85)
      ;
      auVar129 = vdivps_avx(auVar216,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar129,auVar190,auVar73)
      ;
      auVar73 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar60,1);
      auVar157._8_4_ = 0x10;
      auVar157._0_8_ = 0x1000000010;
      auVar157._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar73,auVar157);
      auVar73 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar60,5);
      auVar129._8_4_ = 0x20;
      auVar129._0_8_ = 0x2000000020;
      auVar129._12_4_ = 0x20;
      auVar158._8_4_ = 0x30;
      auVar158._0_8_ = 0x3000000030;
      auVar158._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar158,auVar129,auVar73);
      auVar73 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar60,5);
      auVar85._8_4_ = 0x40;
      auVar85._0_8_ = 0x4000000040;
      auVar85._12_4_ = 0x40;
      auVar159._8_4_ = 0x50;
      auVar159._0_8_ = 0x5000000050;
      auVar159._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar159,auVar85,auVar73)
      ;
      auVar73 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar60);
      auVar129 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar60);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar220 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar73,auVar9);
      auVar73._8_4_ = 0xff800000;
      auVar73._0_8_ = 0xff800000ff800000;
      auVar73._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar73,auVar129,auVar9);
      auVar101 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
      terminated.field_0.i[1] = auVar9._4_4_ ^ auVar46._4_4_;
      terminated.field_0.i[0] = auVar9._0_4_ ^ auVar46._0_4_;
      terminated.field_0.i[2] = auVar9._8_4_ ^ auVar46._8_4_;
      terminated.field_0.i[3] = auVar9._12_4_ ^ auVar46._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar33 = 3;
      }
      else {
        uVar33 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1a20 = ray + 0x80;
      pNVar34 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar36 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
LAB_002fb4c7:
      do {
        do {
          root.ptr = pNVar34[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_002fc79e;
          pNVar34 = pNVar34 + -1;
          paVar36 = paVar36 + -1;
          vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar36->v;
          auVar75 = ZEXT1664((undefined1  [16])vVar2.field_0);
          auVar46 = vcmpps_avx((undefined1  [16])vVar2.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar24 = vmovmskps_avx(auVar46);
        } while (uVar24 == 0);
        uVar35 = (ulong)(byte)uVar24;
        if (uVar33 < (uint)POPCOUNT(uVar24 & 0xff)) {
LAB_002fb507:
          do {
            iVar26 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_002fc79e;
              auVar46 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar75._0_16_,6);
              if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar46 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar46 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar46[0xf]) goto LAB_002fb4c7;
              uVar35 = (ulong)((uint)root.ptr & 0xf);
              if (uVar35 == 8) {
                auVar73 = vpcmpeqd_avx(auVar101._0_16_,auVar101._0_16_);
                aVar47 = terminated.field_0;
                goto LAB_002fc689;
              }
              auVar60._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              auVar60._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
              auVar60._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
              lVar29 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              uVar28 = 0;
              goto LAB_002fb6ea;
            }
            lVar29 = 0;
            sVar32 = 8;
            auVar46 = auVar220._0_16_;
            do {
              sVar31 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar29 * 8);
              if (sVar31 == 8) {
                auVar75 = ZEXT1664(auVar46);
                sVar31 = sVar32;
                break;
              }
              uVar25 = *(undefined4 *)(root.ptr + 0x20 + lVar29 * 4);
              auVar53._4_4_ = uVar25;
              auVar53._0_4_ = uVar25;
              auVar53._8_4_ = uVar25;
              auVar53._12_4_ = uVar25;
              auVar13._8_8_ = tray.org.field_0._8_8_;
              auVar13._0_8_ = tray.org.field_0._0_8_;
              auVar14._8_8_ = tray.org.field_0._24_8_;
              auVar14._0_8_ = tray.org.field_0._16_8_;
              auVar15._8_8_ = tray.org.field_0._40_8_;
              auVar15._0_8_ = tray.org.field_0._32_8_;
              auVar73 = vsubps_avx(auVar53,auVar13);
              auVar160._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar73._0_4_;
              auVar160._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar73._4_4_;
              auVar160._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar73._8_4_;
              auVar160._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar73._12_4_;
              uVar25 = *(undefined4 *)(root.ptr + 0x40 + lVar29 * 4);
              auVar54._4_4_ = uVar25;
              auVar54._0_4_ = uVar25;
              auVar54._8_4_ = uVar25;
              auVar54._12_4_ = uVar25;
              auVar73 = vsubps_avx(auVar54,auVar14);
              auVar178._0_4_ = tray.rdir.field_0._16_4_ * auVar73._0_4_;
              auVar178._4_4_ = tray.rdir.field_0._20_4_ * auVar73._4_4_;
              auVar178._8_4_ = tray.rdir.field_0._24_4_ * auVar73._8_4_;
              auVar178._12_4_ = tray.rdir.field_0._28_4_ * auVar73._12_4_;
              uVar25 = *(undefined4 *)(root.ptr + 0x60 + lVar29 * 4);
              auVar55._4_4_ = uVar25;
              auVar55._0_4_ = uVar25;
              auVar55._8_4_ = uVar25;
              auVar55._12_4_ = uVar25;
              auVar73 = vsubps_avx(auVar55,auVar15);
              auVar200._0_4_ = tray.rdir.field_0._32_4_ * auVar73._0_4_;
              auVar200._4_4_ = tray.rdir.field_0._36_4_ * auVar73._4_4_;
              auVar200._8_4_ = tray.rdir.field_0._40_4_ * auVar73._8_4_;
              auVar200._12_4_ = tray.rdir.field_0._44_4_ * auVar73._12_4_;
              uVar25 = *(undefined4 *)(root.ptr + 0x30 + lVar29 * 4);
              auVar56._4_4_ = uVar25;
              auVar56._0_4_ = uVar25;
              auVar56._8_4_ = uVar25;
              auVar56._12_4_ = uVar25;
              auVar73 = vsubps_avx(auVar56,auVar13);
              auVar79._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar73._0_4_;
              auVar79._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar73._4_4_;
              auVar79._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar73._8_4_;
              auVar79._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar73._12_4_;
              uVar25 = *(undefined4 *)(root.ptr + 0x50 + lVar29 * 4);
              auVar57._4_4_ = uVar25;
              auVar57._0_4_ = uVar25;
              auVar57._8_4_ = uVar25;
              auVar57._12_4_ = uVar25;
              auVar73 = vsubps_avx(auVar57,auVar14);
              auVar109._0_4_ = tray.rdir.field_0._16_4_ * auVar73._0_4_;
              auVar109._4_4_ = tray.rdir.field_0._20_4_ * auVar73._4_4_;
              auVar109._8_4_ = tray.rdir.field_0._24_4_ * auVar73._8_4_;
              auVar109._12_4_ = tray.rdir.field_0._28_4_ * auVar73._12_4_;
              uVar25 = *(undefined4 *)(root.ptr + 0x70 + lVar29 * 4);
              auVar58._4_4_ = uVar25;
              auVar58._0_4_ = uVar25;
              auVar58._8_4_ = uVar25;
              auVar58._12_4_ = uVar25;
              auVar73 = vsubps_avx(auVar58,auVar15);
              auVar130._0_4_ = tray.rdir.field_0._32_4_ * auVar73._0_4_;
              auVar130._4_4_ = tray.rdir.field_0._36_4_ * auVar73._4_4_;
              auVar130._8_4_ = tray.rdir.field_0._40_4_ * auVar73._8_4_;
              auVar130._12_4_ = tray.rdir.field_0._44_4_ * auVar73._12_4_;
              auVar73 = vminps_avx(auVar160,auVar79);
              auVar129 = vminps_avx(auVar178,auVar109);
              auVar73 = vmaxps_avx(auVar73,auVar129);
              auVar129 = vminps_avx(auVar200,auVar130);
              auVar73 = vmaxps_avx(auVar73,auVar129);
              auVar59._0_4_ = auVar224._0_4_ * auVar73._0_4_;
              auVar59._4_4_ = auVar224._4_4_ * auVar73._4_4_;
              auVar59._8_4_ = auVar224._8_4_ * auVar73._8_4_;
              auVar59._12_4_ = auVar224._12_4_ * auVar73._12_4_;
              auVar73 = vmaxps_avx(auVar160,auVar79);
              auVar129 = vmaxps_avx(auVar178,auVar109);
              auVar129 = vminps_avx(auVar73,auVar129);
              auVar73 = vmaxps_avx(auVar200,auVar130);
              auVar73 = vminps_avx(auVar129,auVar73);
              auVar80._0_4_ = auVar228._0_4_ * auVar73._0_4_;
              auVar80._4_4_ = auVar228._4_4_ * auVar73._4_4_;
              auVar80._8_4_ = auVar228._8_4_ * auVar73._8_4_;
              auVar80._12_4_ = auVar228._12_4_ * auVar73._12_4_;
              auVar73 = vmaxps_avx(auVar59,(undefined1  [16])tray.tnear.field_0);
              auVar129 = vminps_avx(auVar80,(undefined1  [16])tray.tfar.field_0);
              auVar73 = vcmpps_avx(auVar73,auVar129,2);
              auVar101 = ZEXT1664(auVar73);
              if ((((auVar73 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar73 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar73 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar73[0xf]) {
                auVar75 = ZEXT1664(auVar46);
                sVar31 = sVar32;
              }
              else {
                auVar73 = vblendvps_avx(auVar220._0_16_,auVar59,auVar73);
                auVar75 = ZEXT1664(auVar73);
                if (sVar32 != 8) {
                  pNVar34->ptr = sVar32;
                  pNVar34 = pNVar34 + 1;
                  *(undefined1 (*) [16])paVar36->v = auVar46;
                  paVar36 = paVar36 + 1;
                }
              }
              lVar29 = lVar29 + 1;
              auVar46 = auVar75._0_16_;
              sVar32 = sVar31;
            } while (lVar29 != 4);
            if (sVar31 == 8) goto LAB_002fb68c;
            auVar46 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar75._0_16_,6);
            uVar25 = vmovmskps_avx(auVar46);
            root.ptr = sVar31;
          } while ((byte)uVar33 < (byte)POPCOUNT(uVar25));
          pNVar34->ptr = sVar31;
          pNVar34 = pNVar34 + 1;
          *paVar36 = auVar75._0_16_;
          paVar36 = paVar36 + 1;
        }
        else {
          do {
            sVar32 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> sVar32 & 1) == 0; sVar32 = sVar32 + 1) {
              }
            }
            auVar101 = ZEXT1664(auVar101._0_16_);
            bVar37 = occluded1(This,bvh,root,sVar32,&pre,ray,&tray,context);
            if (bVar37) {
              terminated.field_0.i[sVar32] = -1;
            }
            uVar35 = uVar35 & uVar35 - 1;
          } while (uVar35 != 0);
          auVar46 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
          iVar26 = 3;
          if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar46[0xf] < '\0') {
            auVar46._8_4_ = 0xff800000;
            auVar46._0_8_ = 0xff800000ff800000;
            auVar46._12_4_ = 0xff800000;
            auVar101 = ZEXT1664(auVar46);
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar46,
                               (undefined1  [16])terminated.field_0);
            iVar26 = 2;
          }
          auVar220 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          auVar75 = ZEXT1664((undefined1  [16])vVar2.field_0);
          if (uVar33 < (uint)POPCOUNT(uVar24 & 0xff)) goto LAB_002fb507;
        }
LAB_002fb68c:
      } while (iVar26 != 3);
LAB_002fc79e:
      auVar9 = vandps_avx(auVar9,(undefined1  [16])terminated.field_0);
      auVar74._8_4_ = 0xff800000;
      auVar74._0_8_ = 0xff800000ff800000;
      auVar74._12_4_ = 0xff800000;
      auVar9 = vmaskmovps_avx(auVar9,auVar74);
      *(undefined1 (*) [16])local_1a20 = auVar9;
    }
  }
  return;
  while( true ) {
    uVar28 = uVar28 + 1;
    lVar29 = lVar29 + 0xe0;
    auVar60 = auVar46;
    if (uVar35 - 8 <= uVar28) break;
LAB_002fb6ea:
    lVar27 = uVar28 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    uVar30 = 0;
    local_1a98 = auVar60;
    while( true ) {
      uVar24 = *(uint *)(lVar29 + uVar30 * 4);
      if ((ulong)uVar24 == 0xffffffff) break;
      uVar25 = *(undefined4 *)(lVar29 + -0xc0 + uVar30 * 4);
      auVar191._4_4_ = uVar25;
      auVar191._0_4_ = uVar25;
      auVar191._8_4_ = uVar25;
      auVar191._12_4_ = uVar25;
      uVar25 = *(undefined4 *)(lVar29 + -0xb0 + uVar30 * 4);
      auVar179._4_4_ = uVar25;
      auVar179._0_4_ = uVar25;
      auVar179._8_4_ = uVar25;
      auVar179._12_4_ = uVar25;
      uVar25 = *(undefined4 *)(lVar29 + -0xa0 + uVar30 * 4);
      auVar110._4_4_ = uVar25;
      auVar110._0_4_ = uVar25;
      auVar110._8_4_ = uVar25;
      auVar110._12_4_ = uVar25;
      local_1a78._4_4_ = *(undefined4 *)(lVar29 + -0x90 + uVar30 * 4);
      local_1a78._0_4_ = local_1a78._4_4_;
      fStack_1a70 = (float)local_1a78._4_4_;
      uStack_1a6c = local_1a78._4_4_;
      local_1a18._4_4_ = *(undefined4 *)(lVar29 + -0x80 + uVar30 * 4);
      local_1a18._0_4_ = local_1a18._4_4_;
      local_1a18._8_4_ = local_1a18._4_4_;
      local_1a18._12_4_ = local_1a18._4_4_;
      local_19c8._4_4_ = *(undefined4 *)(lVar29 + -0x70 + uVar30 * 4);
      local_19c8._0_4_ = local_19c8._4_4_;
      local_19c8._8_4_ = local_19c8._4_4_;
      local_19c8._12_4_ = local_19c8._4_4_;
      local_1988._4_4_ = *(undefined4 *)(lVar29 + -0x60 + uVar30 * 4);
      local_1988._0_4_ = local_1988._4_4_;
      local_1988._8_4_ = local_1988._4_4_;
      local_1988._12_4_ = local_1988._4_4_;
      local_1998._4_4_ = *(undefined4 *)(lVar29 + -0x50 + uVar30 * 4);
      local_1998._0_4_ = local_1998._4_4_;
      local_1998._8_4_ = local_1998._4_4_;
      local_1998._12_4_ = local_1998._4_4_;
      local_19a8._4_4_ = *(undefined4 *)(lVar29 + -0x40 + uVar30 * 4);
      local_19a8._0_4_ = local_19a8._4_4_;
      local_19a8._8_4_ = local_19a8._4_4_;
      local_19a8._12_4_ = local_19a8._4_4_;
      uVar25 = *(undefined4 *)(lVar29 + -0x30 + uVar30 * 4);
      auVar222._4_4_ = uVar25;
      auVar222._0_4_ = uVar25;
      auVar222._8_4_ = uVar25;
      auVar222._12_4_ = uVar25;
      uVar25 = *(undefined4 *)(lVar29 + -0x20 + uVar30 * 4);
      auVar144._4_4_ = uVar25;
      auVar144._0_4_ = uVar25;
      auVar144._8_4_ = uVar25;
      auVar144._12_4_ = uVar25;
      uVar25 = *(undefined4 *)(lVar29 + -0x10 + uVar30 * 4);
      auVar169._4_4_ = uVar25;
      auVar169._0_4_ = uVar25;
      auVar169._8_4_ = uVar25;
      auVar169._12_4_ = uVar25;
      local_18d8 = *(undefined8 *)(lVar27 + 0xd0);
      uStack_18d0 = *(undefined8 *)(lVar27 + 0xd8);
      auVar46 = *(undefined1 (*) [16])(ray + 0x10);
      auVar73 = *(undefined1 (*) [16])(ray + 0x20);
      auVar157 = vsubps_avx(auVar179,auVar46);
      auVar158 = vsubps_avx(auVar110,auVar73);
      auVar159 = vsubps_avx(auVar144,auVar46);
      auVar86 = vsubps_avx(auVar169,auVar73);
      auVar129 = vsubps_avx(auVar159,auVar157);
      auVar85 = vsubps_avx(auVar86,auVar158);
      fVar5 = auVar157._0_4_;
      fVar168 = auVar159._0_4_ + fVar5;
      fVar7 = auVar157._4_4_;
      fVar174 = auVar159._4_4_ + fVar7;
      fVar51 = auVar157._8_4_;
      fVar175 = auVar159._8_4_ + fVar51;
      fVar127 = auVar157._12_4_;
      fVar176 = auVar159._12_4_ + fVar127;
      fVar6 = auVar158._0_4_;
      fVar177 = auVar86._0_4_ + fVar6;
      fVar49 = auVar158._4_4_;
      fVar185 = auVar86._4_4_ + fVar49;
      fVar52 = auVar158._8_4_;
      fVar186 = auVar86._8_4_ + fVar52;
      fVar8 = auVar158._12_4_;
      fVar187 = auVar86._12_4_ + fVar8;
      fVar38 = auVar85._0_4_;
      auVar145._0_4_ = fVar168 * fVar38;
      fVar50 = auVar85._4_4_;
      auVar145._4_4_ = fVar174 * fVar50;
      fVar211 = auVar85._8_4_;
      auVar145._8_4_ = fVar175 * fVar211;
      fVar10 = auVar85._12_4_;
      auVar145._12_4_ = fVar176 * fVar10;
      fVar48 = auVar129._0_4_;
      auVar201._0_4_ = fVar177 * fVar48;
      fVar198 = auVar129._4_4_;
      auVar201._4_4_ = fVar185 * fVar198;
      fVar214 = auVar129._8_4_;
      auVar201._8_4_ = fVar186 * fVar214;
      fVar11 = auVar129._12_4_;
      auVar201._12_4_ = fVar187 * fVar11;
      auVar189 = vsubps_avx(auVar201,auVar145);
      auVar129 = *(undefined1 (*) [16])ray;
      auVar190 = vsubps_avx(auVar191,auVar129);
      auVar216 = vsubps_avx(auVar222,auVar129);
      auVar85 = vsubps_avx(auVar216,auVar190);
      fVar188 = auVar85._0_4_;
      auVar180._0_4_ = fVar188 * fVar177;
      fVar194 = auVar85._4_4_;
      auVar180._4_4_ = fVar194 * fVar185;
      fVar195 = auVar85._8_4_;
      auVar180._8_4_ = fVar195 * fVar186;
      fVar196 = auVar85._12_4_;
      auVar180._12_4_ = fVar196 * fVar187;
      fVar177 = auVar190._0_4_;
      fVar197 = auVar216._0_4_ + fVar177;
      fVar185 = auVar190._4_4_;
      fVar208 = auVar216._4_4_ + fVar185;
      fVar186 = auVar190._8_4_;
      fVar210 = auVar216._8_4_ + fVar186;
      fVar187 = auVar190._12_4_;
      fVar213 = auVar216._12_4_ + fVar187;
      auVar223._0_4_ = fVar197 * fVar38;
      auVar223._4_4_ = fVar208 * fVar50;
      auVar223._8_4_ = fVar210 * fVar211;
      auVar223._12_4_ = fVar213 * fVar10;
      auVar39 = vsubps_avx(auVar223,auVar180);
      auVar181._0_4_ = fVar197 * fVar48;
      auVar181._4_4_ = fVar208 * fVar198;
      auVar181._8_4_ = fVar210 * fVar214;
      auVar181._12_4_ = fVar213 * fVar11;
      auVar170._0_4_ = fVar188 * fVar168;
      auVar170._4_4_ = fVar194 * fVar174;
      auVar170._8_4_ = fVar195 * fVar175;
      auVar170._12_4_ = fVar196 * fVar176;
      auVar61 = vsubps_avx(auVar170,auVar181);
      auVar85 = *(undefined1 (*) [16])(ray + 0x60);
      fVar229 = auVar85._0_4_;
      fVar231 = auVar85._4_4_;
      fVar232 = auVar85._8_4_;
      fVar233 = auVar85._12_4_;
      fVar197 = *(float *)(ray + 0x50);
      fVar208 = *(float *)(ray + 0x54);
      fVar210 = *(float *)(ray + 0x58);
      auVar18 = *(undefined1 (*) [12])(ray + 0x50);
      fVar213 = *(float *)(ray + 0x5c);
      fVar77 = *(float *)(ray + 0x40);
      fVar78 = *(float *)(ray + 0x44);
      fVar103 = *(float *)(ray + 0x48);
      fVar104 = *(float *)(ray + 0x4c);
      local_1918._0_4_ = fVar77 * auVar189._0_4_ + fVar197 * auVar39._0_4_ + fVar229 * auVar61._0_4_
      ;
      local_1918._4_4_ = fVar78 * auVar189._4_4_ + fVar208 * auVar39._4_4_ + fVar231 * auVar61._4_4_
      ;
      fStack_1910 = fVar103 * auVar189._8_4_ + fVar210 * auVar39._8_4_ + fVar232 * auVar61._8_4_;
      fStack_190c = fVar104 * auVar189._12_4_ + fVar213 * auVar39._12_4_ + fVar233 * auVar61._12_4_;
      auVar46 = vsubps_avx(local_1a18,auVar46);
      auVar73 = vsubps_avx(local_19c8,auVar73);
      auVar85 = vsubps_avx(auVar157,auVar46);
      auVar157 = vsubps_avx(auVar158,auVar73);
      fVar128 = fVar5 + auVar46._0_4_;
      fVar140 = fVar7 + auVar46._4_4_;
      fVar141 = fVar51 + auVar46._8_4_;
      fVar142 = fVar127 + auVar46._12_4_;
      fVar107 = fVar6 + auVar73._0_4_;
      fVar124 = fVar49 + auVar73._4_4_;
      fVar125 = fVar52 + auVar73._8_4_;
      fVar126 = fVar8 + auVar73._12_4_;
      fVar168 = auVar157._0_4_;
      auVar161._0_4_ = fVar128 * fVar168;
      fVar174 = auVar157._4_4_;
      auVar161._4_4_ = fVar140 * fVar174;
      fVar175 = auVar157._8_4_;
      auVar161._8_4_ = fVar141 * fVar175;
      fVar176 = auVar157._12_4_;
      auVar161._12_4_ = fVar142 * fVar176;
      fVar221 = auVar85._0_4_;
      auVar182._0_4_ = fVar221 * fVar107;
      fVar225 = auVar85._4_4_;
      auVar182._4_4_ = fVar225 * fVar124;
      fVar226 = auVar85._8_4_;
      auVar182._8_4_ = fVar226 * fVar125;
      fVar227 = auVar85._12_4_;
      auVar182._12_4_ = fVar227 * fVar126;
      auVar85 = vsubps_avx(auVar182,auVar161);
      auVar129 = vsubps_avx(_local_1a78,auVar129);
      auVar157 = vsubps_avx(auVar190,auVar129);
      fVar234 = auVar157._0_4_;
      auVar111._0_4_ = fVar234 * fVar107;
      fVar236 = auVar157._4_4_;
      auVar111._4_4_ = fVar236 * fVar124;
      fVar237 = auVar157._8_4_;
      auVar111._8_4_ = fVar237 * fVar125;
      fVar238 = auVar157._12_4_;
      auVar111._12_4_ = fVar238 * fVar126;
      fVar107 = auVar129._0_4_ + fVar177;
      fVar124 = auVar129._4_4_ + fVar185;
      fVar125 = auVar129._8_4_ + fVar186;
      fVar126 = auVar129._12_4_ + fVar187;
      auVar202._0_4_ = fVar107 * fVar168;
      auVar202._4_4_ = fVar124 * fVar174;
      auVar202._8_4_ = fVar125 * fVar175;
      auVar202._12_4_ = fVar126 * fVar176;
      auVar157 = vsubps_avx(auVar202,auVar111);
      auVar203._0_4_ = fVar107 * fVar221;
      auVar203._4_4_ = fVar124 * fVar225;
      auVar203._8_4_ = fVar125 * fVar226;
      auVar203._12_4_ = fVar126 * fVar227;
      auVar39._0_4_ = fVar234 * fVar128;
      auVar39._4_4_ = fVar236 * fVar140;
      auVar39._8_4_ = fVar237 * fVar141;
      auVar39._12_4_ = fVar238 * fVar142;
      auVar158 = vsubps_avx(auVar39,auVar203);
      auVar204._0_4_ = fVar77 * auVar85._0_4_ + fVar229 * auVar158._0_4_ + fVar197 * auVar157._0_4_;
      auVar204._4_4_ = fVar78 * auVar85._4_4_ + fVar231 * auVar158._4_4_ + fVar208 * auVar157._4_4_;
      auVar204._8_4_ = fVar103 * auVar85._8_4_ + fVar232 * auVar158._8_4_ + fVar210 * auVar157._8_4_
      ;
      auVar204._12_4_ =
           fVar104 * auVar85._12_4_ + fVar233 * auVar158._12_4_ + fVar213 * auVar157._12_4_;
      auVar85 = vsubps_avx(auVar129,auVar216);
      fVar143 = auVar129._0_4_ + auVar216._0_4_;
      fVar154 = auVar129._4_4_ + auVar216._4_4_;
      fVar155 = auVar129._8_4_ + auVar216._8_4_;
      fVar156 = auVar129._12_4_ + auVar216._12_4_;
      auVar129 = vsubps_avx(auVar46,auVar159);
      fVar128 = auVar46._0_4_ + auVar159._0_4_;
      fVar140 = auVar46._4_4_ + auVar159._4_4_;
      fVar141 = auVar46._8_4_ + auVar159._8_4_;
      fVar142 = auVar46._12_4_ + auVar159._12_4_;
      auVar46 = vsubps_avx(auVar73,auVar86);
      fVar76 = auVar73._0_4_ + auVar86._0_4_;
      fVar102 = auVar73._4_4_ + auVar86._4_4_;
      fVar105 = auVar73._8_4_ + auVar86._8_4_;
      fVar106 = auVar73._12_4_ + auVar86._12_4_;
      fVar199 = auVar46._0_4_;
      auVar162._0_4_ = fVar199 * fVar128;
      fVar209 = auVar46._4_4_;
      auVar162._4_4_ = fVar209 * fVar140;
      fVar212 = auVar46._8_4_;
      auVar162._8_4_ = fVar212 * fVar141;
      fVar215 = auVar46._12_4_;
      auVar162._12_4_ = fVar215 * fVar142;
      fVar107 = auVar129._0_4_;
      auVar183._0_4_ = fVar107 * fVar76;
      fVar124 = auVar129._4_4_;
      auVar183._4_4_ = fVar124 * fVar102;
      fVar125 = auVar129._8_4_;
      auVar183._8_4_ = fVar125 * fVar105;
      fVar126 = auVar129._12_4_;
      auVar183._12_4_ = fVar126 * fVar106;
      auVar46 = vsubps_avx(auVar183,auVar162);
      fVar108 = auVar85._0_4_;
      auVar81._0_4_ = fVar108 * fVar76;
      fVar76 = auVar85._4_4_;
      auVar81._4_4_ = fVar76 * fVar102;
      fVar102 = auVar85._8_4_;
      auVar81._8_4_ = fVar102 * fVar105;
      fVar105 = auVar85._12_4_;
      auVar81._12_4_ = fVar105 * fVar106;
      auVar184._0_4_ = fVar199 * fVar143;
      auVar184._4_4_ = fVar209 * fVar154;
      auVar184._8_4_ = fVar212 * fVar155;
      auVar184._12_4_ = fVar215 * fVar156;
      auVar73 = vsubps_avx(auVar184,auVar81);
      auVar146._0_4_ = fVar143 * fVar107;
      auVar146._4_4_ = fVar154 * fVar124;
      auVar146._8_4_ = fVar155 * fVar125;
      auVar146._12_4_ = fVar156 * fVar126;
      auVar61._0_4_ = fVar108 * fVar128;
      auVar61._4_4_ = fVar76 * fVar140;
      auVar61._8_4_ = fVar102 * fVar141;
      auVar61._12_4_ = fVar105 * fVar142;
      auVar129 = vsubps_avx(auVar61,auVar146);
      auVar62._0_4_ = fVar77 * auVar46._0_4_ + fVar229 * auVar129._0_4_ + fVar197 * auVar73._0_4_;
      auVar62._4_4_ = fVar78 * auVar46._4_4_ + fVar231 * auVar129._4_4_ + fVar208 * auVar73._4_4_;
      auVar62._8_4_ = fVar103 * auVar46._8_4_ + fVar232 * auVar129._8_4_ + fVar210 * auVar73._8_4_;
      auVar62._12_4_ =
           fVar104 * auVar46._12_4_ + fVar233 * auVar129._12_4_ + fVar213 * auVar73._12_4_;
      auVar131._0_4_ = auVar62._0_4_ + (float)local_1918._0_4_ + auVar204._0_4_;
      auVar131._4_4_ = auVar62._4_4_ + (float)local_1918._4_4_ + auVar204._4_4_;
      auVar131._8_4_ = auVar62._8_4_ + fStack_1910 + auVar204._8_4_;
      auVar131._12_4_ = auVar62._12_4_ + fStack_190c + auVar204._12_4_;
      auVar46 = vminps_avx(_local_1918,auVar204);
      auVar73 = vminps_avx(auVar46,auVar62);
      auVar147._8_4_ = 0x7fffffff;
      auVar147._0_8_ = 0x7fffffff7fffffff;
      auVar147._12_4_ = 0x7fffffff;
      auVar46 = vandps_avx(auVar131,auVar147);
      auVar148._0_4_ = auVar46._0_4_ * 1.1920929e-07;
      auVar148._4_4_ = auVar46._4_4_ * 1.1920929e-07;
      auVar148._8_4_ = auVar46._8_4_ * 1.1920929e-07;
      auVar148._12_4_ = auVar46._12_4_ * 1.1920929e-07;
      uVar12 = CONCAT44(auVar148._4_4_,auVar148._0_4_);
      auVar163._0_8_ = uVar12 ^ 0x8000000080000000;
      auVar163._8_4_ = -auVar148._8_4_;
      auVar163._12_4_ = -auVar148._12_4_;
      auVar73 = vcmpps_avx(auVar73,auVar163,5);
      auVar129 = vmaxps_avx(_local_1918,auVar204);
      auVar129 = vmaxps_avx(auVar129,auVar62);
      auVar129 = vcmpps_avx(auVar129,auVar148,2);
      auVar73 = vorps_avx(auVar73,auVar129);
      auVar129 = local_1a98 & auVar73;
      if ((((auVar129 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar129 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar129 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar129[0xf]
         ) {
LAB_002fc0e8:
        auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      }
      else {
        auVar63._0_4_ = fVar221 * fVar38;
        auVar63._4_4_ = fVar225 * fVar50;
        auVar63._8_4_ = fVar226 * fVar211;
        auVar63._12_4_ = fVar227 * fVar10;
        auVar82._0_4_ = fVar48 * fVar168;
        auVar82._4_4_ = fVar198 * fVar174;
        auVar82._8_4_ = fVar214 * fVar175;
        auVar82._12_4_ = fVar11 * fVar176;
        auVar157 = vsubps_avx(auVar82,auVar63);
        auVar149._0_4_ = fVar107 * fVar168;
        auVar149._4_4_ = fVar124 * fVar174;
        auVar149._8_4_ = fVar125 * fVar175;
        auVar149._12_4_ = fVar126 * fVar176;
        auVar164._0_4_ = fVar221 * fVar199;
        auVar164._4_4_ = fVar225 * fVar209;
        auVar164._8_4_ = fVar226 * fVar212;
        auVar164._12_4_ = fVar227 * fVar215;
        auVar158 = vsubps_avx(auVar164,auVar149);
        auVar230._8_4_ = 0x7fffffff;
        auVar230._0_8_ = 0x7fffffff7fffffff;
        auVar230._12_4_ = 0x7fffffff;
        auVar129 = vandps_avx(auVar230,auVar63);
        auVar85 = vandps_avx(auVar230,auVar149);
        auVar129 = vcmpps_avx(auVar129,auVar85,1);
        auVar157 = vblendvps_avx(auVar158,auVar157,auVar129);
        auVar64._0_4_ = fVar234 * fVar199;
        auVar64._4_4_ = fVar236 * fVar209;
        auVar64._8_4_ = fVar237 * fVar212;
        auVar64._12_4_ = fVar238 * fVar215;
        auVar83._0_4_ = fVar234 * fVar38;
        auVar83._4_4_ = fVar236 * fVar50;
        auVar83._8_4_ = fVar237 * fVar211;
        auVar83._12_4_ = fVar238 * fVar10;
        auVar150._0_4_ = fVar188 * fVar168;
        auVar150._4_4_ = fVar194 * fVar174;
        auVar150._8_4_ = fVar195 * fVar175;
        auVar150._12_4_ = fVar196 * fVar176;
        auVar158 = vsubps_avx(auVar83,auVar150);
        auVar165._0_4_ = fVar108 * fVar168;
        auVar165._4_4_ = fVar76 * fVar174;
        auVar165._8_4_ = fVar102 * fVar175;
        auVar165._12_4_ = fVar105 * fVar176;
        auVar159 = vsubps_avx(auVar165,auVar64);
        auVar129 = vandps_avx(auVar230,auVar150);
        auVar85 = vandps_avx(auVar230,auVar64);
        auVar129 = vcmpps_avx(auVar129,auVar85,1);
        auVar158 = vblendvps_avx(auVar159,auVar158,auVar129);
        auVar65._0_4_ = fVar221 * fVar108;
        auVar65._4_4_ = fVar225 * fVar76;
        auVar65._8_4_ = fVar226 * fVar102;
        auVar65._12_4_ = fVar227 * fVar105;
        auVar84._0_4_ = fVar188 * fVar221;
        auVar84._4_4_ = fVar194 * fVar225;
        auVar84._8_4_ = fVar195 * fVar226;
        auVar84._12_4_ = fVar196 * fVar227;
        auVar112._0_4_ = fVar234 * fVar48;
        auVar112._4_4_ = fVar236 * fVar198;
        auVar112._8_4_ = fVar237 * fVar214;
        auVar112._12_4_ = fVar238 * fVar11;
        auVar40._0_4_ = fVar234 * fVar107;
        auVar40._4_4_ = fVar236 * fVar124;
        auVar40._8_4_ = fVar237 * fVar125;
        auVar40._12_4_ = fVar238 * fVar126;
        auVar159 = vsubps_avx(auVar84,auVar112);
        auVar86 = vsubps_avx(auVar40,auVar65);
        auVar129 = vandps_avx(auVar230,auVar112);
        auVar85 = vandps_avx(auVar230,auVar65);
        auVar129 = vcmpps_avx(auVar129,auVar85,1);
        auVar159 = vblendvps_avx(auVar86,auVar159,auVar129);
        local_1a48 = auVar18._0_4_;
        fStack_1a44 = auVar18._4_4_;
        fStack_1a40 = auVar18._8_4_;
        fVar38 = fVar77 * auVar157._0_4_ + auVar159._0_4_ * fVar229 + auVar158._0_4_ * local_1a48;
        fVar48 = fVar78 * auVar157._4_4_ + auVar159._4_4_ * fVar231 + auVar158._4_4_ * fStack_1a44;
        fVar168 = fVar103 * auVar157._8_4_ + auVar159._8_4_ * fVar232 + auVar158._8_4_ * fStack_1a40
        ;
        fVar50 = fVar104 * auVar157._12_4_ + auVar159._12_4_ * fVar233 + auVar158._12_4_ * fVar213;
        auVar66._0_4_ = fVar38 + fVar38;
        auVar66._4_4_ = fVar48 + fVar48;
        auVar66._8_4_ = fVar168 + fVar168;
        auVar66._12_4_ = fVar50 + fVar50;
        fVar38 = auVar157._0_4_ * fVar177 + auVar159._0_4_ * fVar6 + auVar158._0_4_ * fVar5;
        fVar49 = auVar157._4_4_ * fVar185 + auVar159._4_4_ * fVar49 + auVar158._4_4_ * fVar7;
        fVar185 = auVar157._8_4_ * fVar186 + auVar159._8_4_ * fVar52 + auVar158._8_4_ * fVar51;
        fVar51 = auVar157._12_4_ * fVar187 + auVar159._12_4_ * fVar8 + auVar158._12_4_ * fVar127;
        auVar129 = vrcpps_avx(auVar66);
        fVar5 = auVar129._0_4_;
        auVar113._0_4_ = auVar66._0_4_ * fVar5;
        fVar6 = auVar129._4_4_;
        auVar113._4_4_ = auVar66._4_4_ * fVar6;
        fVar177 = auVar129._8_4_;
        auVar113._8_4_ = auVar66._8_4_ * fVar177;
        fVar7 = auVar129._12_4_;
        auVar113._12_4_ = auVar66._12_4_ * fVar7;
        auVar132._8_4_ = 0x3f800000;
        auVar132._0_8_ = 0x3f8000003f800000;
        auVar132._12_4_ = 0x3f800000;
        auVar129 = vsubps_avx(auVar132,auVar113);
        auVar41._0_4_ = (fVar38 + fVar38) * (fVar5 + fVar5 * auVar129._0_4_);
        auVar41._4_4_ = (fVar49 + fVar49) * (fVar6 + fVar6 * auVar129._4_4_);
        auVar41._8_4_ = (fVar185 + fVar185) * (fVar177 + fVar177 * auVar129._8_4_);
        auVar41._12_4_ = (fVar51 + fVar51) * (fVar7 + fVar7 * auVar129._12_4_);
        auVar129 = *(undefined1 (*) [16])(ray + 0x80);
        auVar85 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar41,2);
        auVar86 = vcmpps_avx(auVar41,auVar129,2);
        auVar85 = vandps_avx(auVar85,auVar86);
        auVar86 = vcmpps_avx(auVar66,ZEXT816(0) << 0x20,4);
        auVar85 = vandps_avx(auVar86,auVar85);
        auVar73 = vandps_avx(auVar73,local_1a98);
        auVar85 = vpslld_avx(auVar85,0x1f);
        auVar86 = vpsrad_avx(auVar85,0x1f);
        auVar85 = auVar73 & auVar86;
        if ((((auVar85 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar85 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar85 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar85[0xf]
           ) goto LAB_002fc0e8;
        auVar73 = vandps_avx(auVar86,auVar73);
        pGVar3 = (context->scene->geometries).items[uVar24].ptr;
        uVar1 = pGVar3->mask;
        auVar87._4_4_ = uVar1;
        auVar87._0_4_ = uVar1;
        auVar87._8_4_ = uVar1;
        auVar87._12_4_ = uVar1;
        auVar85 = vandps_avx(auVar87,*(undefined1 (*) [16])(ray + 0x90));
        auVar85 = vpcmpeqd_avx(auVar85,ZEXT816(0) << 0x20);
        auVar86 = auVar73 & ~auVar85;
        auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        if ((((auVar86 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar86 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar86 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar86[0xf] < '\0') {
          auVar73 = vandnps_avx(auVar85,auVar73);
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar85 = vrcpps_avx(auVar131);
            fVar5 = auVar85._0_4_;
            auVar118._0_4_ = auVar131._0_4_ * fVar5;
            fVar6 = auVar85._4_4_;
            auVar118._4_4_ = auVar131._4_4_ * fVar6;
            fVar177 = auVar85._8_4_;
            auVar118._8_4_ = auVar131._8_4_ * fVar177;
            fVar7 = auVar85._12_4_;
            auVar118._12_4_ = auVar131._12_4_ * fVar7;
            auVar172._8_4_ = 0x3f800000;
            auVar172._0_8_ = 0x3f8000003f800000;
            auVar172._12_4_ = 0x3f800000;
            auVar85 = vsubps_avx(auVar172,auVar118);
            auVar94._0_4_ = fVar5 + fVar5 * auVar85._0_4_;
            auVar94._4_4_ = fVar6 + fVar6 * auVar85._4_4_;
            auVar94._8_4_ = fVar177 + fVar177 * auVar85._8_4_;
            auVar94._12_4_ = fVar7 + fVar7 * auVar85._12_4_;
            auVar119._8_4_ = 0x219392ef;
            auVar119._0_8_ = 0x219392ef219392ef;
            auVar119._12_4_ = 0x219392ef;
            auVar46 = vcmpps_avx(auVar46,auVar119,5);
            auVar46 = vandps_avx(auVar46,auVar94);
            auVar120._0_4_ = (float)local_1918._0_4_ * auVar46._0_4_;
            auVar120._4_4_ = (float)local_1918._4_4_ * auVar46._4_4_;
            auVar120._8_4_ = fStack_1910 * auVar46._8_4_;
            auVar120._12_4_ = fStack_190c * auVar46._12_4_;
            auVar85 = vminps_avx(auVar120,auVar172);
            auVar95._0_4_ = auVar46._0_4_ * auVar204._0_4_;
            auVar95._4_4_ = auVar46._4_4_ * auVar204._4_4_;
            auVar95._8_4_ = auVar46._8_4_ * auVar204._8_4_;
            auVar95._12_4_ = auVar46._12_4_ * auVar204._12_4_;
            auVar46 = vminps_avx(auVar95,auVar172);
            auVar86 = vsubps_avx(auVar172,auVar85);
            auVar189 = vsubps_avx(auVar172,auVar46);
            auVar17._8_8_ = uVar21;
            auVar17._0_8_ = uVar20;
            local_1898 = vblendvps_avx(auVar85,auVar86,auVar17);
            local_1888 = vblendvps_avx(auVar46,auVar189,auVar17);
            local_1868 = vpshufd_avx(ZEXT416(uVar24),0);
            local_1878 = vpshufd_avx(ZEXT416(*(uint *)((long)&local_18d8 + uVar30 * 4)),0);
            local_18c8[0] = (RTCHitN)auVar157[0];
            local_18c8[1] = (RTCHitN)auVar157[1];
            local_18c8[2] = (RTCHitN)auVar157[2];
            local_18c8[3] = (RTCHitN)auVar157[3];
            local_18c8[4] = (RTCHitN)auVar157[4];
            local_18c8[5] = (RTCHitN)auVar157[5];
            local_18c8[6] = (RTCHitN)auVar157[6];
            local_18c8[7] = (RTCHitN)auVar157[7];
            local_18c8[8] = (RTCHitN)auVar157[8];
            local_18c8[9] = (RTCHitN)auVar157[9];
            local_18c8[10] = (RTCHitN)auVar157[10];
            local_18c8[0xb] = (RTCHitN)auVar157[0xb];
            local_18c8[0xc] = (RTCHitN)auVar157[0xc];
            local_18c8[0xd] = (RTCHitN)auVar157[0xd];
            local_18c8[0xe] = (RTCHitN)auVar157[0xe];
            local_18c8[0xf] = (RTCHitN)auVar157[0xf];
            local_18b8 = auVar158;
            local_18a8 = auVar159;
            vcmpps_avx(ZEXT1632(local_1888),ZEXT1632(local_1888),0xf);
            uStack_1854 = context->user->instID[0];
            local_1858 = uStack_1854;
            uStack_1850 = uStack_1854;
            uStack_184c = uStack_1854;
            uStack_1848 = context->user->instPrimID[0];
            uStack_1844 = uStack_1848;
            uStack_1840 = uStack_1848;
            uStack_183c = uStack_1848;
            auVar46 = vblendvps_avx(auVar129,auVar41,auVar73);
            *(undefined1 (*) [16])(ray + 0x80) = auVar46;
            args.valid = (int *)local_1a38;
            args.geometryUserPtr = pGVar3->userPtr;
            args.context = context->user;
            args.hit = local_18c8;
            args.N = 4;
            local_1a38 = auVar73;
            args.ray = (RTCRayN *)ray;
            if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar101._0_8_ = (*pGVar3->occlusionFilterN)(&args);
              auVar101._8_56_ = extraout_var;
              auVar46 = auVar101._0_16_;
              auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
            }
            if (local_1a38 == (undefined1  [16])0x0) {
              auVar46 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
              auVar46 = auVar46 ^ _DAT_01f7ae20;
            }
            else {
              p_Var4 = context->args->filter;
              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                auVar220._0_8_ = (*p_Var4)(&args);
                auVar220._8_56_ = extraout_var_00;
                auVar46 = auVar220._0_16_;
                auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
                auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              }
              auVar73 = vpcmpeqd_avx(local_1a38,_DAT_01f7aa10);
              auVar46 = vpcmpeqd_avx(auVar46,auVar46);
              auVar46 = auVar73 ^ auVar46;
              auVar96._8_4_ = 0xff800000;
              auVar96._0_8_ = 0xff800000ff800000;
              auVar96._12_4_ = 0xff800000;
              auVar73 = vblendvps_avx(auVar96,*(undefined1 (*) [16])(args.ray + 0x80),auVar73);
              *(undefined1 (*) [16])(args.ray + 0x80) = auVar73;
            }
            auVar46 = vpslld_avx(auVar46,0x1f);
            auVar73 = vpsrad_avx(auVar46,0x1f);
            auVar46 = vblendvps_avx(auVar129,*(undefined1 (*) [16])local_1a20,auVar46);
            *(undefined1 (*) [16])local_1a20 = auVar46;
          }
          local_1a98 = vpandn_avx(auVar73,local_1a98);
        }
      }
      if ((((local_1a98 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (local_1a98 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (local_1a98 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          -1 < local_1a98[0xf]) {
        auVar220 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        break;
      }
      auVar46 = *(undefined1 (*) [16])ray;
      auVar73 = *(undefined1 (*) [16])(ray + 0x10);
      auVar129 = *(undefined1 (*) [16])(ray + 0x20);
      auVar85 = vsubps_avx(local_1988,auVar46);
      auVar157 = vsubps_avx(local_1998,auVar73);
      auVar158 = vsubps_avx(local_19a8,auVar129);
      auVar159 = vsubps_avx(auVar222,auVar46);
      auVar86 = vsubps_avx(auVar144,auVar73);
      auVar189 = vsubps_avx(auVar169,auVar129);
      auVar46 = vsubps_avx(_local_1a78,auVar46);
      auVar73 = vsubps_avx(local_1a18,auVar73);
      auVar129 = vsubps_avx(local_19c8,auVar129);
      auVar190 = vsubps_avx(auVar46,auVar85);
      auVar216 = vsubps_avx(auVar73,auVar157);
      auVar39 = vsubps_avx(auVar129,auVar158);
      fVar5 = auVar157._0_4_;
      fVar185 = auVar73._0_4_ + fVar5;
      fVar6 = auVar157._4_4_;
      fVar51 = auVar73._4_4_ + fVar6;
      fVar177 = auVar157._8_4_;
      fVar186 = auVar73._8_4_ + fVar177;
      fVar7 = auVar157._12_4_;
      fVar127 = auVar73._12_4_ + fVar7;
      fVar234 = auVar158._0_4_;
      fVar187 = fVar234 + auVar129._0_4_;
      fVar236 = auVar158._4_4_;
      fVar38 = fVar236 + auVar129._4_4_;
      fVar237 = auVar158._8_4_;
      fVar168 = fVar237 + auVar129._8_4_;
      fVar238 = auVar158._12_4_;
      fVar50 = fVar238 + auVar129._12_4_;
      fVar49 = auVar39._0_4_;
      auVar205._0_4_ = fVar185 * fVar49;
      fVar52 = auVar39._4_4_;
      auVar205._4_4_ = fVar51 * fVar52;
      fVar8 = auVar39._8_4_;
      auVar205._8_4_ = fVar186 * fVar8;
      fVar48 = auVar39._12_4_;
      auVar205._12_4_ = fVar127 * fVar48;
      fVar221 = auVar216._0_4_;
      auVar217._0_4_ = fVar221 * fVar187;
      fVar225 = auVar216._4_4_;
      auVar217._4_4_ = fVar225 * fVar38;
      fVar226 = auVar216._8_4_;
      auVar217._8_4_ = fVar226 * fVar168;
      fVar227 = auVar216._12_4_;
      auVar217._12_4_ = fVar227 * fVar50;
      auVar216 = vsubps_avx(auVar217,auVar205);
      fVar188 = auVar85._0_4_;
      fVar198 = fVar188 + auVar46._0_4_;
      fVar194 = auVar85._4_4_;
      fVar174 = fVar194 + auVar46._4_4_;
      fVar195 = auVar85._8_4_;
      fVar211 = fVar195 + auVar46._8_4_;
      fVar196 = auVar85._12_4_;
      fVar214 = fVar196 + auVar46._12_4_;
      fVar77 = auVar190._0_4_;
      auVar171._0_4_ = fVar77 * fVar187;
      fVar103 = auVar190._4_4_;
      auVar171._4_4_ = fVar103 * fVar38;
      fVar107 = auVar190._8_4_;
      auVar171._8_4_ = fVar107 * fVar168;
      fVar125 = auVar190._12_4_;
      auVar171._12_4_ = fVar125 * fVar50;
      auVar218._0_4_ = fVar198 * fVar49;
      auVar218._4_4_ = fVar174 * fVar52;
      auVar218._8_4_ = fVar211 * fVar8;
      auVar218._12_4_ = fVar214 * fVar48;
      auVar190 = vsubps_avx(auVar218,auVar171);
      auVar206._0_4_ = fVar198 * fVar221;
      auVar206._4_4_ = fVar174 * fVar225;
      auVar206._8_4_ = fVar211 * fVar226;
      auVar206._12_4_ = fVar214 * fVar227;
      auVar114._0_4_ = fVar77 * fVar185;
      auVar114._4_4_ = fVar103 * fVar51;
      auVar114._8_4_ = fVar107 * fVar186;
      auVar114._12_4_ = fVar125 * fVar127;
      auVar39 = vsubps_avx(auVar114,auVar206);
      fVar198 = *(float *)(ray + 0x60);
      fVar174 = *(float *)(ray + 100);
      fVar211 = *(float *)(ray + 0x68);
      auVar18 = *(undefined1 (*) [12])(ray + 0x60);
      fVar214 = *(float *)(ray + 0x6c);
      local_1a18 = *(undefined1 (*) [16])(ray + 0x50);
      fVar143 = local_1a18._0_4_;
      fVar154 = local_1a18._4_4_;
      fVar155 = local_1a18._8_4_;
      fVar156 = local_1a18._12_4_;
      fVar175 = *(float *)(ray + 0x40);
      fVar10 = *(float *)(ray + 0x44);
      fVar11 = *(float *)(ray + 0x48);
      auVar19 = *(undefined1 (*) [12])(ray + 0x40);
      fVar176 = *(float *)(ray + 0x4c);
      auVar219._0_4_ = auVar216._0_4_ * fVar175 + fVar198 * auVar39._0_4_ + fVar143 * auVar190._0_4_
      ;
      auVar219._4_4_ = auVar216._4_4_ * fVar10 + fVar174 * auVar39._4_4_ + fVar154 * auVar190._4_4_;
      auVar219._8_4_ = auVar216._8_4_ * fVar11 + fVar211 * auVar39._8_4_ + fVar155 * auVar190._8_4_;
      auVar219._12_4_ =
           auVar216._12_4_ * fVar176 + fVar214 * auVar39._12_4_ + fVar156 * auVar190._12_4_;
      auVar157 = vsubps_avx(auVar157,auVar86);
      auVar158 = vsubps_avx(auVar158,auVar189);
      fVar197 = fVar5 + auVar86._0_4_;
      fVar208 = fVar6 + auVar86._4_4_;
      fVar210 = fVar177 + auVar86._8_4_;
      fVar213 = fVar7 + auVar86._12_4_;
      fVar51 = fVar234 + auVar189._0_4_;
      fVar127 = fVar236 + auVar189._4_4_;
      fVar38 = fVar237 + auVar189._8_4_;
      fVar50 = fVar238 + auVar189._12_4_;
      fVar185 = auVar158._0_4_;
      auVar235._0_4_ = fVar197 * fVar185;
      fVar186 = auVar158._4_4_;
      auVar235._4_4_ = fVar208 * fVar186;
      fVar187 = auVar158._8_4_;
      auVar235._8_4_ = fVar210 * fVar187;
      fVar168 = auVar158._12_4_;
      auVar235._12_4_ = fVar213 * fVar168;
      fVar76 = auVar157._0_4_;
      auVar133._0_4_ = fVar76 * fVar51;
      fVar105 = auVar157._4_4_;
      auVar133._4_4_ = fVar105 * fVar127;
      fVar106 = auVar157._8_4_;
      auVar133._8_4_ = fVar106 * fVar38;
      fVar108 = auVar157._12_4_;
      auVar133._12_4_ = fVar108 * fVar50;
      auVar157 = vsubps_avx(auVar133,auVar235);
      auVar85 = vsubps_avx(auVar85,auVar159);
      fVar229 = auVar85._0_4_;
      auVar88._0_4_ = fVar229 * fVar51;
      fVar231 = auVar85._4_4_;
      auVar88._4_4_ = fVar231 * fVar127;
      fVar232 = auVar85._8_4_;
      auVar88._8_4_ = fVar232 * fVar38;
      fVar233 = auVar85._12_4_;
      auVar88._12_4_ = fVar233 * fVar50;
      fVar51 = fVar188 + auVar159._0_4_;
      fVar127 = fVar194 + auVar159._4_4_;
      fVar38 = fVar195 + auVar159._8_4_;
      fVar50 = fVar196 + auVar159._12_4_;
      auVar207._0_4_ = fVar51 * fVar185;
      auVar207._4_4_ = fVar127 * fVar186;
      auVar207._8_4_ = fVar38 * fVar187;
      auVar207._12_4_ = fVar50 * fVar168;
      auVar85 = vsubps_avx(auVar207,auVar88);
      auVar192._0_4_ = fVar51 * fVar76;
      auVar192._4_4_ = fVar127 * fVar105;
      auVar192._8_4_ = fVar38 * fVar106;
      auVar192._12_4_ = fVar50 * fVar108;
      auVar115._0_4_ = fVar229 * fVar197;
      auVar115._4_4_ = fVar231 * fVar208;
      auVar115._8_4_ = fVar232 * fVar210;
      auVar115._12_4_ = fVar233 * fVar213;
      auVar158 = vsubps_avx(auVar115,auVar192);
      auVar193._0_4_ = fVar175 * auVar157._0_4_ + fVar198 * auVar158._0_4_ + fVar143 * auVar85._0_4_
      ;
      auVar193._4_4_ = fVar10 * auVar157._4_4_ + fVar174 * auVar158._4_4_ + fVar154 * auVar85._4_4_;
      auVar193._8_4_ = fVar11 * auVar157._8_4_ + fVar211 * auVar158._8_4_ + fVar155 * auVar85._8_4_;
      auVar193._12_4_ =
           fVar176 * auVar157._12_4_ + fVar214 * auVar158._12_4_ + fVar156 * auVar85._12_4_;
      auVar85 = vsubps_avx(auVar159,auVar46);
      fVar197 = auVar159._0_4_ + auVar46._0_4_;
      fVar208 = auVar159._4_4_ + auVar46._4_4_;
      fVar210 = auVar159._8_4_ + auVar46._8_4_;
      fVar213 = auVar159._12_4_ + auVar46._12_4_;
      auVar46 = vsubps_avx(auVar86,auVar73);
      fVar78 = auVar86._0_4_ + auVar73._0_4_;
      fVar104 = auVar86._4_4_ + auVar73._4_4_;
      fVar124 = auVar86._8_4_ + auVar73._8_4_;
      fVar126 = auVar86._12_4_ + auVar73._12_4_;
      auVar73 = vsubps_avx(auVar189,auVar129);
      fVar128 = auVar189._0_4_ + auVar129._0_4_;
      fVar140 = auVar189._4_4_ + auVar129._4_4_;
      fVar141 = auVar189._8_4_ + auVar129._8_4_;
      fVar142 = auVar189._12_4_ + auVar129._12_4_;
      fVar51 = auVar73._0_4_;
      auVar42._0_4_ = fVar78 * fVar51;
      fVar127 = auVar73._4_4_;
      auVar42._4_4_ = fVar104 * fVar127;
      fVar38 = auVar73._8_4_;
      auVar42._8_4_ = fVar124 * fVar38;
      fVar50 = auVar73._12_4_;
      auVar42._12_4_ = fVar126 * fVar50;
      fVar199 = auVar46._0_4_;
      auVar166._0_4_ = fVar199 * fVar128;
      fVar209 = auVar46._4_4_;
      auVar166._4_4_ = fVar209 * fVar140;
      fVar212 = auVar46._8_4_;
      auVar166._8_4_ = fVar212 * fVar141;
      fVar215 = auVar46._12_4_;
      auVar166._12_4_ = fVar215 * fVar142;
      auVar46 = vsubps_avx(auVar166,auVar42);
      fVar102 = auVar85._0_4_;
      auVar134._0_4_ = fVar102 * fVar128;
      fVar128 = auVar85._4_4_;
      auVar134._4_4_ = fVar128 * fVar140;
      fVar140 = auVar85._8_4_;
      auVar134._8_4_ = fVar140 * fVar141;
      fVar141 = auVar85._12_4_;
      auVar134._12_4_ = fVar141 * fVar142;
      auVar167._0_4_ = fVar197 * fVar51;
      auVar167._4_4_ = fVar208 * fVar127;
      auVar167._8_4_ = fVar210 * fVar38;
      auVar167._12_4_ = fVar213 * fVar50;
      auVar73 = vsubps_avx(auVar167,auVar134);
      auVar67._0_4_ = fVar199 * fVar197;
      auVar67._4_4_ = fVar209 * fVar208;
      auVar67._8_4_ = fVar212 * fVar210;
      auVar67._12_4_ = fVar215 * fVar213;
      auVar89._0_4_ = fVar102 * fVar78;
      auVar89._4_4_ = fVar128 * fVar104;
      auVar89._8_4_ = fVar140 * fVar124;
      auVar89._12_4_ = fVar141 * fVar126;
      auVar129 = vsubps_avx(auVar89,auVar67);
      auVar68._0_4_ = fVar175 * auVar46._0_4_ + fVar198 * auVar129._0_4_ + fVar143 * auVar73._0_4_;
      auVar68._4_4_ = fVar10 * auVar46._4_4_ + fVar174 * auVar129._4_4_ + fVar154 * auVar73._4_4_;
      auVar68._8_4_ = fVar11 * auVar46._8_4_ + fVar211 * auVar129._8_4_ + fVar155 * auVar73._8_4_;
      auVar68._12_4_ =
           fVar176 * auVar46._12_4_ + fVar214 * auVar129._12_4_ + fVar156 * auVar73._12_4_;
      auVar43._0_4_ = auVar68._0_4_ + auVar219._0_4_ + auVar193._0_4_;
      auVar43._4_4_ = auVar68._4_4_ + auVar219._4_4_ + auVar193._4_4_;
      auVar43._8_4_ = auVar68._8_4_ + auVar219._8_4_ + auVar193._8_4_;
      auVar43._12_4_ = auVar68._12_4_ + auVar219._12_4_ + auVar193._12_4_;
      auVar46 = vminps_avx(auVar219,auVar193);
      auVar73 = vminps_avx(auVar46,auVar68);
      auVar135._8_4_ = 0x7fffffff;
      auVar135._0_8_ = 0x7fffffff7fffffff;
      auVar135._12_4_ = 0x7fffffff;
      auVar46 = vandps_avx(auVar43,auVar135);
      auVar136._0_4_ = auVar46._0_4_ * 1.1920929e-07;
      auVar136._4_4_ = auVar46._4_4_ * 1.1920929e-07;
      auVar136._8_4_ = auVar46._8_4_ * 1.1920929e-07;
      auVar136._12_4_ = auVar46._12_4_ * 1.1920929e-07;
      uVar12 = CONCAT44(auVar136._4_4_,auVar136._0_4_);
      auVar151._0_8_ = uVar12 ^ 0x8000000080000000;
      auVar151._8_4_ = -auVar136._8_4_;
      auVar151._12_4_ = -auVar136._12_4_;
      auVar73 = vcmpps_avx(auVar73,auVar151,5);
      auVar129 = vmaxps_avx(auVar219,auVar193);
      auVar129 = vmaxps_avx(auVar129,auVar68);
      auVar129 = vcmpps_avx(auVar129,auVar136,2);
      auVar73 = vorps_avx(auVar73,auVar129);
      auVar129 = local_1a98 & auVar73;
      if ((((auVar129 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar129 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar129 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar129[0xf]
         ) {
LAB_002fc351:
        auVar220 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      }
      else {
        auVar69._0_4_ = fVar49 * fVar76;
        auVar69._4_4_ = fVar52 * fVar105;
        auVar69._8_4_ = fVar8 * fVar106;
        auVar69._12_4_ = fVar48 * fVar108;
        auVar90._0_4_ = fVar221 * fVar185;
        auVar90._4_4_ = fVar225 * fVar186;
        auVar90._8_4_ = fVar226 * fVar187;
        auVar90._12_4_ = fVar227 * fVar168;
        auVar157 = vsubps_avx(auVar90,auVar69);
        auVar137._0_4_ = fVar199 * fVar185;
        auVar137._4_4_ = fVar209 * fVar186;
        auVar137._8_4_ = fVar212 * fVar187;
        auVar137._12_4_ = fVar215 * fVar168;
        auVar152._0_4_ = fVar76 * fVar51;
        auVar152._4_4_ = fVar105 * fVar127;
        auVar152._8_4_ = fVar106 * fVar38;
        auVar152._12_4_ = fVar108 * fVar50;
        auVar158 = vsubps_avx(auVar152,auVar137);
        auVar129 = vandps_avx(auVar135,auVar69);
        auVar85 = vandps_avx(auVar135,auVar137);
        auVar129 = vcmpps_avx(auVar129,auVar85,1);
        auVar157 = vblendvps_avx(auVar158,auVar157,auVar129);
        auVar70._0_4_ = fVar229 * fVar51;
        auVar70._4_4_ = fVar231 * fVar127;
        auVar70._8_4_ = fVar232 * fVar38;
        auVar70._12_4_ = fVar233 * fVar50;
        auVar91._0_4_ = fVar229 * fVar49;
        auVar91._4_4_ = fVar231 * fVar52;
        auVar91._8_4_ = fVar232 * fVar8;
        auVar91._12_4_ = fVar233 * fVar48;
        auVar138._0_4_ = fVar77 * fVar185;
        auVar138._4_4_ = fVar103 * fVar186;
        auVar138._8_4_ = fVar107 * fVar187;
        auVar138._12_4_ = fVar125 * fVar168;
        auVar158 = vsubps_avx(auVar91,auVar138);
        auVar153._0_4_ = fVar185 * fVar102;
        auVar153._4_4_ = fVar186 * fVar128;
        auVar153._8_4_ = fVar187 * fVar140;
        auVar153._12_4_ = fVar168 * fVar141;
        auVar159 = vsubps_avx(auVar153,auVar70);
        auVar129 = vandps_avx(auVar135,auVar138);
        auVar85 = vandps_avx(auVar135,auVar70);
        auVar129 = vcmpps_avx(auVar129,auVar85,1);
        auVar158 = vblendvps_avx(auVar159,auVar158,auVar129);
        auVar71._0_4_ = fVar102 * fVar76;
        auVar71._4_4_ = fVar128 * fVar105;
        auVar71._8_4_ = fVar140 * fVar106;
        auVar71._12_4_ = fVar141 * fVar108;
        auVar92._0_4_ = fVar77 * fVar76;
        auVar92._4_4_ = fVar103 * fVar105;
        auVar92._8_4_ = fVar107 * fVar106;
        auVar92._12_4_ = fVar125 * fVar108;
        auVar116._0_4_ = fVar229 * fVar221;
        auVar116._4_4_ = fVar231 * fVar225;
        auVar116._8_4_ = fVar232 * fVar226;
        auVar116._12_4_ = fVar233 * fVar227;
        auVar44._0_4_ = fVar229 * fVar199;
        auVar44._4_4_ = fVar231 * fVar209;
        auVar44._8_4_ = fVar232 * fVar212;
        auVar44._12_4_ = fVar233 * fVar215;
        auVar159 = vsubps_avx(auVar92,auVar116);
        auVar86 = vsubps_avx(auVar44,auVar71);
        auVar129 = vandps_avx(auVar135,auVar116);
        auVar85 = vandps_avx(auVar135,auVar71);
        auVar129 = vcmpps_avx(auVar129,auVar85,1);
        auVar159 = vblendvps_avx(auVar86,auVar159,auVar129);
        local_1a78._0_4_ = auVar18._0_4_;
        local_1a78._4_4_ = auVar18._4_4_;
        fStack_1a70 = auVar18._8_4_;
        local_1a88 = auVar19._0_4_;
        fStack_1a84 = auVar19._4_4_;
        fStack_1a80 = auVar19._8_4_;
        fVar49 = auVar157._0_4_ * local_1a88 +
                 auVar159._0_4_ * (float)local_1a78._0_4_ + auVar158._0_4_ * fVar143;
        fVar185 = auVar157._4_4_ * fStack_1a84 +
                  auVar159._4_4_ * (float)local_1a78._4_4_ + auVar158._4_4_ * fVar154;
        fVar51 = auVar157._8_4_ * fStack_1a80 +
                 auVar159._8_4_ * fStack_1a70 + auVar158._8_4_ * fVar155;
        fVar52 = auVar157._12_4_ * fVar176 + auVar159._12_4_ * fVar214 + auVar158._12_4_ * fVar156;
        auVar72._0_4_ = fVar49 + fVar49;
        auVar72._4_4_ = fVar185 + fVar185;
        auVar72._8_4_ = fVar51 + fVar51;
        auVar72._12_4_ = fVar52 + fVar52;
        fVar49 = auVar157._0_4_ * fVar188 + auVar159._0_4_ * fVar234 + auVar158._0_4_ * fVar5;
        fVar185 = auVar157._4_4_ * fVar194 + auVar159._4_4_ * fVar236 + auVar158._4_4_ * fVar6;
        fVar51 = auVar157._8_4_ * fVar195 + auVar159._8_4_ * fVar237 + auVar158._8_4_ * fVar177;
        fVar52 = auVar157._12_4_ * fVar196 + auVar159._12_4_ * fVar238 + auVar158._12_4_ * fVar7;
        auVar129 = vrcpps_avx(auVar72);
        fVar5 = auVar129._0_4_;
        auVar117._0_4_ = auVar72._0_4_ * fVar5;
        fVar6 = auVar129._4_4_;
        auVar117._4_4_ = auVar72._4_4_ * fVar6;
        fVar177 = auVar129._8_4_;
        auVar117._8_4_ = auVar72._8_4_ * fVar177;
        fVar7 = auVar129._12_4_;
        auVar117._12_4_ = auVar72._12_4_ * fVar7;
        auVar139._8_4_ = 0x3f800000;
        auVar139._0_8_ = 0x3f8000003f800000;
        auVar139._12_4_ = 0x3f800000;
        auVar129 = vsubps_avx(auVar139,auVar117);
        auVar45._0_4_ = (fVar49 + fVar49) * (fVar5 + fVar5 * auVar129._0_4_);
        auVar45._4_4_ = (fVar185 + fVar185) * (fVar6 + fVar6 * auVar129._4_4_);
        auVar45._8_4_ = (fVar51 + fVar51) * (fVar177 + fVar177 * auVar129._8_4_);
        auVar45._12_4_ = (fVar52 + fVar52) * (fVar7 + fVar7 * auVar129._12_4_);
        auVar129 = *(undefined1 (*) [16])(ray + 0x80);
        auVar85 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar45,2);
        auVar86 = vcmpps_avx(auVar45,auVar129,2);
        auVar85 = vandps_avx(auVar85,auVar86);
        auVar86 = vcmpps_avx(auVar72,ZEXT816(0) << 0x20,4);
        auVar85 = vandps_avx(auVar86,auVar85);
        auVar73 = vandps_avx(auVar73,local_1a98);
        auVar85 = vpslld_avx(auVar85,0x1f);
        auVar86 = vpsrad_avx(auVar85,0x1f);
        auVar85 = auVar73 & auVar86;
        if ((((auVar85 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar85 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar85 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar85[0xf]
           ) goto LAB_002fc351;
        auVar73 = vandps_avx(auVar86,auVar73);
        uVar1 = *(uint *)(lVar29 + uVar30 * 4);
        pGVar3 = (context->scene->geometries).items[uVar1].ptr;
        uVar24 = pGVar3->mask;
        auVar93._4_4_ = uVar24;
        auVar93._0_4_ = uVar24;
        auVar93._8_4_ = uVar24;
        auVar93._12_4_ = uVar24;
        auVar85 = vandps_avx(auVar93,*(undefined1 (*) [16])(ray + 0x90));
        auVar85 = vpcmpeqd_avx(auVar85,ZEXT816(0) << 0x20);
        auVar86 = auVar73 & ~auVar85;
        auVar220 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        if ((((auVar86 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar86 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar86 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar86[0xf] < '\0') {
          auVar73 = vandnps_avx(auVar85,auVar73);
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar85 = vrcpps_avx(auVar43);
            fVar5 = auVar85._0_4_;
            auVar121._0_4_ = auVar43._0_4_ * fVar5;
            fVar6 = auVar85._4_4_;
            auVar121._4_4_ = auVar43._4_4_ * fVar6;
            fVar177 = auVar85._8_4_;
            auVar121._8_4_ = auVar43._8_4_ * fVar177;
            fVar7 = auVar85._12_4_;
            auVar121._12_4_ = auVar43._12_4_ * fVar7;
            auVar173._8_4_ = 0x3f800000;
            auVar173._0_8_ = 0x3f8000003f800000;
            auVar173._12_4_ = 0x3f800000;
            auVar85 = vsubps_avx(auVar173,auVar121);
            auVar97._0_4_ = fVar5 + fVar5 * auVar85._0_4_;
            auVar97._4_4_ = fVar6 + fVar6 * auVar85._4_4_;
            auVar97._8_4_ = fVar177 + fVar177 * auVar85._8_4_;
            auVar97._12_4_ = fVar7 + fVar7 * auVar85._12_4_;
            auVar122._8_4_ = 0x219392ef;
            auVar122._0_8_ = 0x219392ef219392ef;
            auVar122._12_4_ = 0x219392ef;
            auVar46 = vcmpps_avx(auVar46,auVar122,5);
            auVar46 = vandps_avx(auVar46,auVar97);
            auVar123._0_4_ = auVar46._0_4_ * auVar219._0_4_;
            auVar123._4_4_ = auVar46._4_4_ * auVar219._4_4_;
            auVar123._8_4_ = auVar46._8_4_ * auVar219._8_4_;
            auVar123._12_4_ = auVar46._12_4_ * auVar219._12_4_;
            auVar85 = vminps_avx(auVar123,auVar173);
            auVar98._0_4_ = auVar46._0_4_ * auVar193._0_4_;
            auVar98._4_4_ = auVar46._4_4_ * auVar193._4_4_;
            auVar98._8_4_ = auVar46._8_4_ * auVar193._8_4_;
            auVar98._12_4_ = auVar46._12_4_ * auVar193._12_4_;
            auVar46 = vminps_avx(auVar98,auVar173);
            auVar86 = vsubps_avx(auVar173,auVar85);
            auVar189 = vsubps_avx(auVar173,auVar46);
            auVar16._8_8_ = uVar23;
            auVar16._0_8_ = uVar22;
            local_1898 = vblendvps_avx(auVar85,auVar86,auVar16);
            local_1888 = vblendvps_avx(auVar46,auVar189,auVar16);
            local_1868 = vpshufd_avx(ZEXT416(uVar1),0);
            local_1878 = vpshufd_avx(ZEXT416(*(uint *)((long)&local_18d8 + uVar30 * 4)),0);
            local_18c8[0] = (RTCHitN)auVar157[0];
            local_18c8[1] = (RTCHitN)auVar157[1];
            local_18c8[2] = (RTCHitN)auVar157[2];
            local_18c8[3] = (RTCHitN)auVar157[3];
            local_18c8[4] = (RTCHitN)auVar157[4];
            local_18c8[5] = (RTCHitN)auVar157[5];
            local_18c8[6] = (RTCHitN)auVar157[6];
            local_18c8[7] = (RTCHitN)auVar157[7];
            local_18c8[8] = (RTCHitN)auVar157[8];
            local_18c8[9] = (RTCHitN)auVar157[9];
            local_18c8[10] = (RTCHitN)auVar157[10];
            local_18c8[0xb] = (RTCHitN)auVar157[0xb];
            local_18c8[0xc] = (RTCHitN)auVar157[0xc];
            local_18c8[0xd] = (RTCHitN)auVar157[0xd];
            local_18c8[0xe] = (RTCHitN)auVar157[0xe];
            local_18c8[0xf] = (RTCHitN)auVar157[0xf];
            local_18b8 = auVar158;
            local_18a8 = auVar159;
            vcmpps_avx(ZEXT1632(local_1888),ZEXT1632(local_1888),0xf);
            uStack_1854 = context->user->instID[0];
            local_1858 = uStack_1854;
            uStack_1850 = uStack_1854;
            uStack_184c = uStack_1854;
            uStack_1848 = context->user->instPrimID[0];
            uStack_1844 = uStack_1848;
            uStack_1840 = uStack_1848;
            uStack_183c = uStack_1848;
            auVar46 = vblendvps_avx(auVar129,auVar45,auVar73);
            *(undefined1 (*) [16])(ray + 0x80) = auVar46;
            args.valid = (int *)local_1a38;
            args.geometryUserPtr = pGVar3->userPtr;
            args.context = context->user;
            args.hit = local_18c8;
            args.N = 4;
            local_1a38 = auVar73;
            args.ray = (RTCRayN *)ray;
            if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar224._0_8_ = (*pGVar3->occlusionFilterN)(&args);
              auVar224._8_56_ = extraout_var_01;
              auVar46 = auVar224._0_16_;
              auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar220 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            if (local_1a38 == (undefined1  [16])0x0) {
              auVar46 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
              auVar46 = auVar46 ^ _DAT_01f7ae20;
            }
            else {
              p_Var4 = context->args->filter;
              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                auVar228._0_8_ = (*p_Var4)(&args);
                auVar228._8_56_ = extraout_var_02;
                auVar46 = auVar228._0_16_;
                auVar228 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
                auVar224 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar220 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              }
              auVar73 = vpcmpeqd_avx(local_1a38,_DAT_01f7aa10);
              auVar46 = vpcmpeqd_avx(auVar46,auVar46);
              auVar46 = auVar73 ^ auVar46;
              auVar99._8_4_ = 0xff800000;
              auVar99._0_8_ = 0xff800000ff800000;
              auVar99._12_4_ = 0xff800000;
              auVar73 = vblendvps_avx(auVar99,*(undefined1 (*) [16])(args.ray + 0x80),auVar73);
              *(undefined1 (*) [16])(args.ray + 0x80) = auVar73;
            }
            auVar46 = vpslld_avx(auVar46,0x1f);
            auVar73 = vpsrad_avx(auVar46,0x1f);
            auVar46 = vblendvps_avx(auVar129,*(undefined1 (*) [16])local_1a20,auVar46);
            *(undefined1 (*) [16])local_1a20 = auVar46;
          }
          local_1a98 = vpandn_avx(auVar73,local_1a98);
        }
      }
      if (((((local_1a98 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (local_1a98 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (local_1a98 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           -1 < local_1a98[0xf]) || (bVar37 = 2 < uVar30, uVar30 = uVar30 + 1, bVar37)) break;
    }
    auVar46 = vandps_avx(local_1a98,auVar60);
    auVar60 = auVar60 & local_1a98;
    if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar60 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar60 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar60[0xf])
    break;
  }
  auVar73 = vpcmpeqd_avx(local_1a98,local_1a98);
  aVar47._0_4_ = auVar46._0_4_ ^ auVar73._0_4_;
  aVar47._4_4_ = auVar46._4_4_ ^ auVar73._4_4_;
  aVar47._8_4_ = auVar46._8_4_ ^ auVar73._8_4_;
  aVar47._12_4_ = auVar46._12_4_ ^ auVar73._12_4_;
LAB_002fc689:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx((undefined1  [16])terminated.field_0,(undefined1  [16])aVar47);
  auVar73 = auVar73 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar73 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar73 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar73 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar73[0xf])
  goto LAB_002fc79e;
  auVar100._8_4_ = 0xff800000;
  auVar100._0_8_ = 0xff800000ff800000;
  auVar100._12_4_ = 0xff800000;
  auVar101 = ZEXT1664(auVar100);
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar100,
                     (undefined1  [16])terminated.field_0);
  goto LAB_002fb4c7;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }